

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

int linenoiseEditInsert(linenoiseState *l,char c)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  ssize_t sVar4;
  char local_19 [8];
  char c_local;
  
  uVar1 = l->len;
  if (uVar1 < l->buflen) {
    pcVar2 = l->buf;
    sVar3 = l->pos;
    local_19[0] = c;
    if (uVar1 - sVar3 == 0) {
      pcVar2[uVar1] = c;
      l->pos = l->pos + 1;
      sVar3 = l->len;
      l->len = sVar3 + 1;
      l->buf[sVar3 + 1] = '\0';
      if ((mlmode == 0) && (l->len + l->plen < l->cols)) {
        sVar4 = write(l->ofd,local_19,1);
        if (sVar4 != -1) {
          return 0;
        }
        return -1;
      }
    }
    else {
      memmove(pcVar2 + sVar3 + 1,pcVar2 + sVar3,uVar1 - sVar3);
      l->buf[l->pos] = c;
      sVar3 = l->len;
      l->len = sVar3 + 1;
      l->pos = l->pos + 1;
      l->buf[sVar3 + 1] = '\0';
    }
    linenoiseRefreshLine();
  }
  return 0;
}

Assistant:

int linenoiseEditInsert(struct linenoiseState *l, char c) {
    if (l->len < l->buflen) {
        if (l->len == l->pos) {
            l->buf[l->pos] = c;
            l->pos++;
            l->len++;
            l->buf[l->len] = '\0';
            if ((!mlmode && l->plen+l->len < l->cols) /* || mlmode */) {
                /* Avoid a full update of the line in the
                 * trivial case. */
                if (write(l->ofd,&c,1) == -1) return -1;
            } else {
                linenoiseRefreshLine();
            }
        } else {
            memmove(l->buf+l->pos+1,l->buf+l->pos,l->len-l->pos);
            l->buf[l->pos] = c;
            l->len++;
            l->pos++;
            l->buf[l->len] = '\0';
            linenoiseRefreshLine();
        }
    }
    return 0;
}